

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall XPMP2::SocketNetworking::setBlocking(SocketNetworking *this,bool bBlock)

{
  uint uVar1;
  int iVar2;
  XPMP2Error *this_00;
  NetRuntimeError *pNVar3;
  allocator<char> local_39;
  string local_38;
  
  if (this->f_socket == -1) {
    this_00 = (XPMP2Error *)__cxa_allocate_exception(0x78);
    XPMP2Error::XPMP2Error
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Network.cpp"
               ,0x248,"setBlocking","ASSERT FAILED: %s","f_socket != INVALID_SOCKET");
    __cxa_throw(this_00,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
  }
  uVar1 = fcntl(this->f_socket,3,0);
  if (uVar1 != 0xffffffff) {
    iVar2 = fcntl(this->f_socket,4,(ulong)((uint)!bBlock << 0xb | uVar1 & 0xfffff7ff));
    if (-1 < iVar2) {
      return;
    }
    pNVar3 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"fcntl failed to set blocking flag",&local_39);
    NetRuntimeError::NetRuntimeError(pNVar3,&local_38);
    __cxa_throw(pNVar3,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  pNVar3 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"fcntl failed to get flags",&local_39);
  NetRuntimeError::NetRuntimeError(pNVar3,&local_38);
  __cxa_throw(pNVar3,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
}

Assistant:

void SocketNetworking::setBlocking (bool bBlock)
{
    LOG_ASSERT(f_socket != INVALID_SOCKET);

 #if IBM
    unsigned long mode = bBlock ? 0 : 1;
    if (ioctlsocket(f_socket, FIONBIO, &mode) == SOCKET_ERROR)
        throw NetRuntimeError("ioctlsocket failed to set blocking flag");
 #else
    int flags = fcntl(f_socket, F_GETFL, 0);
    if (flags == -1)
        throw NetRuntimeError("fcntl failed to get flags");
    flags = bBlock ? (flags & ~O_NONBLOCK) : (flags | O_NONBLOCK);
    if (fcntl(f_socket, F_SETFL, flags) < 0)
        throw NetRuntimeError("fcntl failed to set blocking flag");
 #endif
}